

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void av1_twopass_postencode_update(AV1_COMP *cpi)

{
  FIRSTPASS_STATS **ppFVar1;
  int64_t *piVar2;
  FIRSTPASS_STATS *pFVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  FRAME_UPDATE_TYPE FVar8;
  byte bVar9;
  aom_enc_pass aVar10;
  uint uVar11;
  aom_rc_mode aVar12;
  int iVar13;
  AV1_PRIMARY *pAVar14;
  FIRSTPASS_STATS *pFVar15;
  FIRSTPASS_STATS *pFVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int *piVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  int *piVar29;
  FrameProbInfo *pFVar30;
  int *piVar31;
  int *piVar32;
  undefined8 uVar33;
  
  pAVar14 = cpi->ppi;
  aVar10 = (cpi->oxcf).pass;
  if ((((AOM_RC_FIRST_PASS < aVar10) ||
       (((aVar10 == AOM_RC_ONE_PASS && (cpi->compressor_stage == '\0')) &&
        (pAVar14->lap_enabled != 0)))) &&
      ((cpi->use_ducky_encode == 0 || ((cpi->ducky_encode_info).frame_info.gop_mode != '\x01')))) &&
     (((int)(uint)cpi->gf_frame_index < (pAVar14->gf_group).size || ((cpi->rc).frames_to_key == 0)))
     ) {
    FVar8 = (pAVar14->gf_group).update_type[cpi->gf_frame_index];
    if ((FVar8 == '\x03') || (FVar8 == '\x06')) {
      if (pAVar14->lap_enabled != 0) {
        (cpi->twopass_frame).stats_in = ((pAVar14->twopass).stats_buf_ctx)->stats_in_start;
      }
    }
    else {
      pFVar15 = (cpi->twopass_frame).stats_in;
      pFVar3 = pFVar15 + -1;
      (cpi->twopass_frame).stats_in = pFVar3;
      pFVar16 = ((pAVar14->twopass).stats_buf_ctx)->stats_in_end;
      if (pAVar14->lap_enabled == 0) {
        if (pFVar3 < pFVar16) {
          (cpi->twopass_frame).stats_in = pFVar15;
        }
      }
      else if (pFVar3 < pFVar16) {
        memmove((pAVar14->twopass).frame_stats_arr[0],(pAVar14->twopass).frame_stats_arr[1],
                (long)pFVar16 + (-0xe8 - (long)pFVar3));
        ppFVar1 = &((pAVar14->twopass).stats_buf_ctx)->stats_in_end;
        *ppFVar1 = *ppFVar1 + -1;
      }
    }
  }
  uVar11 = (cpi->rc).base_frame_target;
  iVar19 = (cpi->rc).projected_frame_size;
  lVar21 = (long)(int)(uVar11 - iVar19) + (pAVar14->p_rc).vbr_bits_off_target;
  (pAVar14->p_rc).vbr_bits_off_target = lVar21;
  lVar26 = (pAVar14->twopass).bits_left - (long)(int)uVar11;
  lVar22 = 0;
  if (0 < lVar26) {
    lVar22 = lVar26;
  }
  (pAVar14->twopass).bits_left = lVar22;
  if (cpi->do_update_vbr_bits_off_target_fast != 0) {
    piVar2 = &(pAVar14->p_rc).vbr_bits_off_target_fast;
    *piVar2 = *piVar2 - (long)(cpi->rc).frame_level_fast_extra_bits;
    (cpi->rc).frame_level_fast_extra_bits = 0;
  }
  iVar20 = (pAVar14->twopass).rolling_arf_group_target_bits;
  iVar28 = iVar20 + uVar11;
  if ((int)(uVar11 ^ 0x7fffffff) < iVar20) {
    iVar28 = 0x7fffffff;
  }
  (pAVar14->twopass).rolling_arf_group_target_bits = iVar28;
  piVar24 = &(pAVar14->twopass).rolling_arf_group_actual_bits;
  *piVar24 = *piVar24 + iVar19;
  lVar22 = (pAVar14->p_rc).total_actual_bits;
  if (lVar22 == 0) {
    (pAVar14->p_rc).rate_error_estimate = 0;
  }
  else {
    iVar20 = (int)((lVar21 * 100) / lVar22);
    iVar19 = 100;
    if (iVar20 < 100) {
      iVar19 = iVar20;
    }
    iVar20 = -100;
    if (-100 < iVar19) {
      iVar20 = iVar19;
    }
    (pAVar14->p_rc).rate_error_estimate = iVar20;
  }
  if (((cpi->rc).is_src_frame_alt_ref == 0) &&
     (lVar22 = (long)(cpi->ppi->gf_group).layer_depth[cpi->gf_frame_index], lVar22 < 7)) {
    lVar22 = lVar22 + 0x2b33;
    do {
      *(int *)((long)pAVar14->parallel_cpi + lVar22 * 4) = (cpi->common).quant_params.base_qindex;
      iVar19 = (int)lVar22;
      lVar22 = lVar22 + 1;
    } while (iVar19 != 0x2b39);
  }
  bVar9 = (cpi->common).current_frame.frame_type;
  if (bVar9 != 0) {
    piVar2 = &(pAVar14->twopass).kf_group_bits;
    *piVar2 = *piVar2 - (long)(cpi->rc).base_frame_target;
    (pAVar14->twopass).last_kfgroup_zeromotion_pct = (pAVar14->twopass).kf_zeromotion_pct;
  }
  lVar22 = (pAVar14->twopass).kf_group_bits;
  lVar21 = 0;
  if (0 < lVar22) {
    lVar21 = lVar22;
  }
  (pAVar14->twopass).kf_group_bits = lVar21;
  aVar12 = (cpi->oxcf).rc_cfg.mode;
  if (((aVar12 == AOM_Q) || ((cpi->rc).is_src_frame_alt_ref != 0)) ||
     (iVar19 = (pAVar14->p_rc).rolling_target_bits, iVar19 < 1)) goto LAB_001fc260;
  iVar20 = -0x30;
  if (aVar12 == AOM_CQ) {
    iVar20 = -0x14;
  }
  iVar28 = 0x30;
  if (aVar12 == AOM_CQ) {
    iVar28 = 0x14;
  }
  iVar25 = (cpi->rc).worst_quality - (cpi->rc).active_worst_quality;
  iVar13 = (cpi->oxcf).rc_cfg.under_shoot_pct;
  if ((iVar13 < 100) &&
     (iVar23 = (pAVar14->p_rc).rolling_actual_bits, iVar18 = iVar19 - iVar23,
     iVar18 != 0 && iVar23 <= iVar19)) {
    if ((iVar13 <= (iVar18 * 100) / iVar19) && (0 < (pAVar14->p_rc).rate_error_estimate)) {
      uVar4 = (pAVar14->twopass).extend_minq;
      uVar6 = (pAVar14->twopass).extend_maxq;
      uVar33 = CONCAT44(uVar6 + -1,uVar4 + 1);
LAB_001fc565:
      (pAVar14->twopass).extend_minq = (int)uVar33;
      (pAVar14->twopass).extend_maxq = (int)((ulong)uVar33 >> 0x20);
    }
  }
  else {
    iVar13 = (cpi->oxcf).rc_cfg.over_shoot_pct;
    if ((iVar13 < 100) &&
       (iVar23 = (pAVar14->p_rc).rolling_actual_bits, iVar18 = iVar23 - iVar19,
       iVar18 != 0 && iVar19 <= iVar23)) {
      iVar19 = (iVar18 * 100) / iVar19;
      iVar23 = 100;
      if (iVar19 < 100) {
        iVar23 = iVar19;
      }
      iVar19 = 0;
      if (0 < iVar23) {
        iVar19 = iVar23;
      }
      if ((iVar13 <= iVar19) && ((pAVar14->p_rc).rate_error_estimate < 0)) {
        uVar5 = (pAVar14->twopass).extend_minq;
        uVar7 = (pAVar14->twopass).extend_maxq;
        uVar33 = CONCAT44(uVar7 + 1,uVar5 + -1);
        goto LAB_001fc565;
      }
    }
  }
  iVar19 = (pAVar14->twopass).extend_minq;
  iVar13 = (pAVar14->twopass).extend_maxq;
  if (iVar19 < iVar28) {
    iVar28 = iVar19;
  }
  if (iVar19 < iVar20) {
    iVar28 = iVar20;
  }
  (pAVar14->twopass).extend_minq = iVar28;
  if (iVar13 < iVar25) {
    iVar25 = iVar13;
  }
  iVar19 = 0;
  if (-1 < iVar13) {
    iVar19 = iVar25;
  }
  (pAVar14->twopass).extend_maxq = iVar19;
  if ((((bVar9 & 0xfd) != 0) &&
      (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2)) &&
     (iVar20 = (cpi->rc).base_frame_target / 2, iVar19 = (cpi->rc).projected_frame_size,
     iVar28 = iVar20 - iVar19, iVar28 != 0 && iVar19 <= iVar20)) {
    lVar21 = (long)iVar28 + (pAVar14->p_rc).vbr_bits_off_target_fast;
    (pAVar14->p_rc).vbr_bits_off_target_fast = lVar21;
    lVar22 = (long)(cpi->rc).avg_frame_bandwidth * 4;
    if (lVar21 < lVar22) {
      lVar22 = lVar21;
    }
    (pAVar14->p_rc).vbr_bits_off_target_fast = lVar22;
  }
LAB_001fc260:
  pAVar14 = cpi->ppi;
  if (-1 < cpi->num_frame_recode) {
    piVar24 = cpi->frame_new_probs[0].tx_type_probs[0][0] + 0xf;
    piVar29 = cpi->frame_new_probs[0].switchable_interp_probs[0][0] + 2;
    pFVar30 = cpi->frame_new_probs;
    lVar22 = 0;
    do {
      if ((cpi->do_update_frame_probs_txtype[lVar22] != 0) &&
         (0 < (pAVar14->gf_group).frame_parallel_level[cpi->gf_frame_index])) {
        uVar27 = (ulong)(pAVar14->gf_group).update_type[cpi->gf_frame_index];
        piVar31 = piVar24 + uVar27 * 0x130;
        piVar32 = (pAVar14->frame_probs).tx_type_probs[uVar27][0] + 0xf;
        lVar21 = 0;
        do {
          lVar26 = 0;
          iVar19 = 0x400;
          do {
            iVar28 = piVar32[lVar26] + piVar31[lVar26] >> 1;
            iVar20 = iVar28;
            if (lVar26 == -0xf) {
              iVar20 = iVar19;
            }
            piVar32[lVar26] = iVar20;
            lVar26 = lVar26 + -1;
            iVar19 = iVar19 - iVar28;
          } while (lVar26 != -0x10);
          lVar21 = lVar21 + 1;
          piVar31 = piVar31 + 0x10;
          piVar32 = piVar32 + 0x10;
        } while (lVar21 != 0x13);
      }
      if ((cpi->do_update_frame_probs_obmc[lVar22] != 0) &&
         (0 < (pAVar14->gf_group).frame_parallel_level[cpi->gf_frame_index])) {
        bVar9 = (pAVar14->gf_group).update_type[cpi->gf_frame_index];
        lVar21 = 0;
        do {
          (pAVar14->frame_probs).obmc_probs[bVar9][lVar21] =
               (pAVar14->frame_probs).obmc_probs[bVar9][lVar21] + pFVar30->obmc_probs[bVar9][lVar21]
               >> 1;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x16);
      }
      if ((cpi->do_update_frame_probs_warp[lVar22] != 0) &&
         (0 < (pAVar14->gf_group).frame_parallel_level[cpi->gf_frame_index])) {
        bVar9 = (pAVar14->gf_group).update_type[cpi->gf_frame_index];
        (pAVar14->frame_probs).warped_probs[bVar9] =
             (pAVar14->frame_probs).warped_probs[bVar9] +
             cpi->frame_new_probs[lVar22].warped_probs[bVar9] >> 1;
      }
      if ((cpi->do_update_frame_probs_interpfilter[lVar22] != 0) &&
         (0 < (pAVar14->gf_group).frame_parallel_level[cpi->gf_frame_index])) {
        uVar27 = (ulong)(pAVar14->gf_group).update_type[cpi->gf_frame_index];
        piVar31 = piVar29 + uVar27 * 0x30;
        piVar32 = (pAVar14->frame_probs).switchable_interp_probs[uVar27][0] + 2;
        lVar21 = 0;
        do {
          lVar26 = 0;
          iVar19 = 0x600;
          do {
            iVar28 = piVar32[lVar26] + piVar31[lVar26] >> 1;
            iVar20 = iVar28;
            if (lVar26 == -2) {
              iVar20 = iVar19;
            }
            piVar32[lVar26] = iVar20;
            lVar26 = lVar26 + -1;
            iVar19 = iVar19 - iVar28;
          } while (lVar26 != -3);
          lVar21 = lVar21 + 1;
          piVar31 = piVar31 + 3;
          piVar32 = piVar32 + 3;
        } while (lVar21 != 0x10);
      }
      piVar24 = piVar24 + 0xa41;
      pFVar30 = pFVar30 + 1;
      piVar29 = piVar29 + 0xa41;
      bVar17 = lVar22 < cpi->num_frame_recode;
      lVar22 = lVar22 + 1;
    } while (bVar17);
  }
  if (((cpi->common).show_frame != 0) &&
     (0 < (pAVar14->gf_group).frame_parallel_level[cpi->gf_frame_index])) {
    cpi->framerate = cpi->new_framerate;
  }
  return;
}

Assistant:

void av1_twopass_postencode_update(AV1_COMP *cpi) {
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;

  // Increment the stats_in pointer.
  if (is_stat_consumption_stage(cpi) &&
      !(cpi->use_ducky_encode && cpi->ducky_encode_info.frame_info.gop_mode ==
                                     DUCKY_ENCODE_GOP_MODE_RCL) &&
      (cpi->gf_frame_index < cpi->ppi->gf_group.size ||
       rc->frames_to_key == 0)) {
    const int update_type = cpi->ppi->gf_group.update_type[cpi->gf_frame_index];
    if (update_type != ARF_UPDATE && update_type != INTNL_ARF_UPDATE) {
      FIRSTPASS_STATS this_frame;
      assert(cpi->twopass_frame.stats_in >
             twopass->stats_buf_ctx->stats_in_start);
      --cpi->twopass_frame.stats_in;
      if (cpi->ppi->lap_enabled) {
        input_stats_lap(twopass, &cpi->twopass_frame, &this_frame);
      } else {
        input_stats(twopass, &cpi->twopass_frame, &this_frame);
      }
    } else if (cpi->ppi->lap_enabled) {
      cpi->twopass_frame.stats_in = twopass->stats_buf_ctx->stats_in_start;
    }
  }

  // VBR correction is done through rc->vbr_bits_off_target. Based on the
  // sign of this value, a limited % adjustment is made to the target rate
  // of subsequent frames, to try and push it back towards 0. This method
  // is designed to prevent extreme behaviour at the end of a clip
  // or group of frames.
  p_rc->vbr_bits_off_target += rc->base_frame_target - rc->projected_frame_size;
  twopass->bits_left = AOMMAX(twopass->bits_left - rc->base_frame_target, 0);

  if (cpi->do_update_vbr_bits_off_target_fast) {
    // Subtract current frame's fast_extra_bits.
    p_rc->vbr_bits_off_target_fast -= rc->frame_level_fast_extra_bits;
    rc->frame_level_fast_extra_bits = 0;
  }

  // Target vs actual bits for this arf group.
  if (twopass->rolling_arf_group_target_bits >
      INT_MAX - rc->base_frame_target) {
    twopass->rolling_arf_group_target_bits = INT_MAX;
  } else {
    twopass->rolling_arf_group_target_bits += rc->base_frame_target;
  }
  twopass->rolling_arf_group_actual_bits += rc->projected_frame_size;

  // Calculate the pct rc error.
  if (p_rc->total_actual_bits) {
    p_rc->rate_error_estimate =
        (int)((p_rc->vbr_bits_off_target * 100) / p_rc->total_actual_bits);
    p_rc->rate_error_estimate = clamp(p_rc->rate_error_estimate, -100, 100);
  } else {
    p_rc->rate_error_estimate = 0;
  }

#if CONFIG_FPMT_TEST
  /* The variables temp_vbr_bits_off_target, temp_bits_left,
   * temp_rolling_arf_group_target_bits, temp_rolling_arf_group_actual_bits
   * temp_rate_error_estimate are introduced for quality simulation purpose,
   * it retains the value previous to the parallel encode frames. The
   * variables are updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  const int simulate_parallel_frame =
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
  int show_existing_between_parallel_frames =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);

  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      simulate_parallel_frame) {
    cpi->ppi->p_rc.temp_vbr_bits_off_target = p_rc->vbr_bits_off_target;
    cpi->ppi->p_rc.temp_bits_left = twopass->bits_left;
    cpi->ppi->p_rc.temp_rolling_arf_group_target_bits =
        twopass->rolling_arf_group_target_bits;
    cpi->ppi->p_rc.temp_rolling_arf_group_actual_bits =
        twopass->rolling_arf_group_actual_bits;
    cpi->ppi->p_rc.temp_rate_error_estimate = p_rc->rate_error_estimate;
  }
#endif
  // Update the active best quality pyramid.
  if (!rc->is_src_frame_alt_ref) {
    const int pyramid_level =
        cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index];
    int i;
    for (i = pyramid_level; i <= MAX_ARF_LAYERS; ++i) {
      p_rc->active_best_quality[i] = cpi->common.quant_params.base_qindex;
#if CONFIG_TUNE_VMAF
      if (cpi->vmaf_info.original_qindex != -1 &&
          (cpi->oxcf.tune_cfg.tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
           cpi->oxcf.tune_cfg.tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN)) {
        p_rc->active_best_quality[i] = cpi->vmaf_info.original_qindex;
      }
#endif
    }
  }

#if 0
  {
    AV1_COMMON *cm = &cpi->common;
    FILE *fpfile;
    fpfile = fopen("details.stt", "a");
    fprintf(fpfile,
            "%10d %10d %10d %10" PRId64 " %10" PRId64
            " %10d %10d %10d %10.4lf %10.4lf %10.4lf %10.4lf\n",
            cm->current_frame.frame_number, rc->base_frame_target,
            rc->projected_frame_size, rc->total_actual_bits,
            rc->vbr_bits_off_target, p_rc->rate_error_estimate,
            twopass->rolling_arf_group_target_bits,
            twopass->rolling_arf_group_actual_bits,
            (double)twopass->rolling_arf_group_actual_bits /
                (double)twopass->rolling_arf_group_target_bits,
            twopass->bpm_factor,
            av1_convert_qindex_to_q(cpi->common.quant_params.base_qindex,
                                    cm->seq_params->bit_depth),
            av1_convert_qindex_to_q(rc->active_worst_quality,
                                    cm->seq_params->bit_depth));
    fclose(fpfile);
  }
#endif

  if (cpi->common.current_frame.frame_type != KEY_FRAME) {
    twopass->kf_group_bits -= rc->base_frame_target;
    twopass->last_kfgroup_zeromotion_pct = twopass->kf_zeromotion_pct;
  }
  twopass->kf_group_bits = AOMMAX(twopass->kf_group_bits, 0);

  // If the rate control is drifting consider adjustment to min or maxq.
  if ((rc_cfg->mode != AOM_Q) && !cpi->rc.is_src_frame_alt_ref &&
      (p_rc->rolling_target_bits > 0)) {
    int minq_adj_limit;
    int maxq_adj_limit;
    minq_adj_limit =
        (rc_cfg->mode == AOM_CQ ? MINQ_ADJ_LIMIT_CQ : MINQ_ADJ_LIMIT);
    maxq_adj_limit = (rc->worst_quality - rc->active_worst_quality);

    // Undershoot
    if ((rc_cfg->under_shoot_pct < 100) &&
        (p_rc->rolling_actual_bits < p_rc->rolling_target_bits)) {
      int pct_error =
          ((p_rc->rolling_target_bits - p_rc->rolling_actual_bits) * 100) /
          p_rc->rolling_target_bits;

      if ((pct_error >= rc_cfg->under_shoot_pct) &&
          (p_rc->rate_error_estimate > 0)) {
        twopass->extend_minq += 1;
        twopass->extend_maxq -= 1;
      }

      // Overshoot
    } else if ((rc_cfg->over_shoot_pct < 100) &&
               (p_rc->rolling_actual_bits > p_rc->rolling_target_bits)) {
      int pct_error =
          ((p_rc->rolling_actual_bits - p_rc->rolling_target_bits) * 100) /
          p_rc->rolling_target_bits;

      pct_error = clamp(pct_error, 0, 100);
      if ((pct_error >= rc_cfg->over_shoot_pct) &&
          (p_rc->rate_error_estimate < 0)) {
        twopass->extend_maxq += 1;
        twopass->extend_minq -= 1;
      }
    }
    twopass->extend_minq =
        clamp(twopass->extend_minq, -minq_adj_limit, minq_adj_limit);
    twopass->extend_maxq = clamp(twopass->extend_maxq, 0, maxq_adj_limit);

    // If there is a big and undexpected undershoot then feed the extra
    // bits back in quickly. One situation where this may happen is if a
    // frame is unexpectedly almost perfectly predicted by the ARF or GF
    // but not very well predcited by the previous frame.
    if (!frame_is_kf_gf_arf(cpi) && !cpi->rc.is_src_frame_alt_ref) {
      int fast_extra_thresh = rc->base_frame_target / HIGH_UNDERSHOOT_RATIO;
      if (rc->projected_frame_size < fast_extra_thresh) {
        p_rc->vbr_bits_off_target_fast +=
            fast_extra_thresh - rc->projected_frame_size;
        p_rc->vbr_bits_off_target_fast =
            AOMMIN(p_rc->vbr_bits_off_target_fast,
                   (4 * (int64_t)rc->avg_frame_bandwidth));
      }
    }

#if CONFIG_FPMT_TEST
    if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
        simulate_parallel_frame) {
      cpi->ppi->p_rc.temp_vbr_bits_off_target_fast =
          p_rc->vbr_bits_off_target_fast;
      cpi->ppi->p_rc.temp_extend_minq = twopass->extend_minq;
      cpi->ppi->p_rc.temp_extend_maxq = twopass->extend_maxq;
    }
#endif
  }

  // Update the frame probabilities obtained from parallel encode frames
  FrameProbInfo *const frame_probs = &cpi->ppi->frame_probs;
#if CONFIG_FPMT_TEST
  /* The variable temp_active_best_quality is introduced only for quality
   * simulation purpose, it retains the value previous to the parallel
   * encode frames. The variable is updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      simulate_parallel_frame) {
    int i;
    const int pyramid_level =
        cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index];
    if (!rc->is_src_frame_alt_ref) {
      for (i = pyramid_level; i <= MAX_ARF_LAYERS; ++i)
        cpi->ppi->p_rc.temp_active_best_quality[i] =
            p_rc->active_best_quality[i];
    }
  }

  // Update the frame probabilities obtained from parallel encode frames
  FrameProbInfo *const temp_frame_probs_simulation =
      simulate_parallel_frame ? &cpi->ppi->temp_frame_probs_simulation
                              : frame_probs;
  FrameProbInfo *const temp_frame_probs =
      simulate_parallel_frame ? &cpi->ppi->temp_frame_probs : NULL;
#endif
  int i, j, loop;
  // Sequentially do average on temp_frame_probs_simulation which holds
  // probabilities of last frame before parallel encode
  for (loop = 0; loop <= cpi->num_frame_recode; loop++) {
    // Sequentially update tx_type_probs
    if (cpi->do_update_frame_probs_txtype[loop] &&
        (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
      for (i = 0; i < TX_SIZES_ALL; i++) {
        int left = 1024;

        for (j = TX_TYPES - 1; j >= 0; j--) {
          const int new_prob =
              cpi->frame_new_probs[loop].tx_type_probs[update_type][i][j];
#if CONFIG_FPMT_TEST
          int prob =
              (temp_frame_probs_simulation->tx_type_probs[update_type][i][j] +
               new_prob) >>
              1;
          left -= prob;
          if (j == 0) prob += left;
          temp_frame_probs_simulation->tx_type_probs[update_type][i][j] = prob;
#else
          int prob =
              (frame_probs->tx_type_probs[update_type][i][j] + new_prob) >> 1;
          left -= prob;
          if (j == 0) prob += left;
          frame_probs->tx_type_probs[update_type][i][j] = prob;
#endif
        }
      }
    }

    // Sequentially update obmc_probs
    if (cpi->do_update_frame_probs_obmc[loop] &&
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);

      for (i = 0; i < BLOCK_SIZES_ALL; i++) {
        const int new_prob =
            cpi->frame_new_probs[loop].obmc_probs[update_type][i];
#if CONFIG_FPMT_TEST
        temp_frame_probs_simulation->obmc_probs[update_type][i] =
            (temp_frame_probs_simulation->obmc_probs[update_type][i] +
             new_prob) >>
            1;
#else
        frame_probs->obmc_probs[update_type][i] =
            (frame_probs->obmc_probs[update_type][i] + new_prob) >> 1;
#endif
      }
    }

    // Sequentially update warped_probs
    if (cpi->do_update_frame_probs_warp[loop] &&
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
      const int new_prob = cpi->frame_new_probs[loop].warped_probs[update_type];
#if CONFIG_FPMT_TEST
      temp_frame_probs_simulation->warped_probs[update_type] =
          (temp_frame_probs_simulation->warped_probs[update_type] + new_prob) >>
          1;
#else
      frame_probs->warped_probs[update_type] =
          (frame_probs->warped_probs[update_type] + new_prob) >> 1;
#endif
    }

    // Sequentially update switchable_interp_probs
    if (cpi->do_update_frame_probs_interpfilter[loop] &&
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      const FRAME_UPDATE_TYPE update_type =
          get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);

      for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) {
        int left = 1536;

        for (j = SWITCHABLE_FILTERS - 1; j >= 0; j--) {
          const int new_prob = cpi->frame_new_probs[loop]
                                   .switchable_interp_probs[update_type][i][j];
#if CONFIG_FPMT_TEST
          int prob = (temp_frame_probs_simulation
                          ->switchable_interp_probs[update_type][i][j] +
                      new_prob) >>
                     1;
          left -= prob;
          if (j == 0) prob += left;

          temp_frame_probs_simulation
              ->switchable_interp_probs[update_type][i][j] = prob;
#else
          int prob = (frame_probs->switchable_interp_probs[update_type][i][j] +
                      new_prob) >>
                     1;
          left -= prob;
          if (j == 0) prob += left;
          frame_probs->switchable_interp_probs[update_type][i][j] = prob;
#endif
        }
      }
    }
  }

#if CONFIG_FPMT_TEST
  // Copying temp_frame_probs_simulation to temp_frame_probs based on
  // the flag
  if (cpi->do_frame_data_update &&
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
      simulate_parallel_frame) {
    for (int update_type_idx = 0; update_type_idx < FRAME_UPDATE_TYPES;
         update_type_idx++) {
      for (i = 0; i < BLOCK_SIZES_ALL; i++) {
        temp_frame_probs->obmc_probs[update_type_idx][i] =
            temp_frame_probs_simulation->obmc_probs[update_type_idx][i];
      }
      temp_frame_probs->warped_probs[update_type_idx] =
          temp_frame_probs_simulation->warped_probs[update_type_idx];
      for (i = 0; i < TX_SIZES_ALL; i++) {
        for (j = 0; j < TX_TYPES; j++) {
          temp_frame_probs->tx_type_probs[update_type_idx][i][j] =
              temp_frame_probs_simulation->tx_type_probs[update_type_idx][i][j];
        }
      }
      for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) {
        for (j = 0; j < SWITCHABLE_FILTERS; j++) {
          temp_frame_probs->switchable_interp_probs[update_type_idx][i][j] =
              temp_frame_probs_simulation
                  ->switchable_interp_probs[update_type_idx][i][j];
        }
      }
    }
  }
#endif
  // Update framerate obtained from parallel encode frames
  if (cpi->common.show_frame &&
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
    cpi->framerate = cpi->new_framerate;
#if CONFIG_FPMT_TEST
  // SIMULATION PURPOSE
  int show_existing_between_parallel_frames_cndn =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);
  if (cpi->common.show_frame && !show_existing_between_parallel_frames_cndn &&
      cpi->do_frame_data_update && simulate_parallel_frame)
    cpi->temp_framerate = cpi->framerate;
#endif
}